

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::removedRow(SPxBasisBase<double> *this,int i)

{
  bool bVar1;
  Representation RVar2;
  SPxStatus SVar3;
  int iVar4;
  DataKey *pDVar5;
  DataKey *pDVar6;
  SVectorBase<double> *pSVar7;
  SVectorBase<double> **ppSVar8;
  Status *pSVar9;
  SPxBasisBase<double> *in_RDI;
  SPxId id;
  int j;
  SPxRowId *in_stack_ffffffffffffff88;
  int i_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Status SVar10;
  undefined8 in_stack_ffffffffffffff98;
  SPxBasisBase<double> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar11;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  SPxRowId local_20;
  DataKey local_18;
  int local_10;
  
  SVar3 = (SPxStatus)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  RVar2 = SPxSolverBase<double>::rep(in_RDI->theLP);
  iVar11 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (RVar2 == ROW) {
    Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar11);
    bVar1 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
      in_RDI->factorized = false;
      SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[39],_0>
                (in_RDI,(char (*) [39])"DCHBAS05 Warning: deleting basic row!\n");
    }
  }
  else {
    in_RDI->factorized = false;
    Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),iVar11);
    bVar1 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (Status)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    if (bVar1) {
      SVar3 = status(in_RDI);
      if ((NO_PROBLEM < SVar3) && ((in_RDI->matrixIsSetup & 1U) != 0)) {
        for (local_10 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x271705); -1 < local_10
            ; local_10 = local_10 + -1) {
          pDVar5 = &baseId((SPxBasisBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20))->super_DataKey;
          local_18 = *pDVar5;
          bVar1 = SPxId::isSPxRowId((SPxId *)&local_18);
          in_stack_ffffffffffffffc7 = 0;
          if (bVar1) {
            SPxRowId::SPxRowId(&local_20,(SPxId *)&local_18);
            bVar1 = SPxLPBase<double>::has
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
            in_stack_ffffffffffffffc7 = bVar1 ^ 0xff;
          }
          if ((in_stack_ffffffffffffffc7 & 1) != 0) {
            SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x271790);
            i_00 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
            pDVar5 = &baseId((SPxBasisBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i_00)->
                      super_DataKey;
            pDVar6 = &baseId((SPxBasisBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i_00)->
                      super_DataKey;
            *pDVar6 = *pDVar5;
            iVar11 = local_10;
            iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2717d3);
            if (iVar11 < iVar4) {
              baseId((SPxBasisBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),i_00);
              pSVar7 = SPxSolverBase<double>::vector
                                 ((SPxSolverBase<double> *)
                                  CONCAT44(iVar11,in_stack_ffffffffffffffb0),(SPxId *)pDVar5);
              ppSVar8 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                                  (&in_RDI->matrix,local_10);
              *ppSVar8 = pSVar7;
            }
            break;
          }
        }
      }
    }
    else {
      setStatus(in_stack_ffffffffffffffa0,SVar3);
      SPxOut::debug<soplex::SPxBasisBase<double>,_const_char_(&)[42],_0>
                (in_RDI,(char (*) [42])"DCHBAS06 Warning: deleting nonbasic row!\n");
    }
  }
  iVar11 = (int)((ulong)&in_RDI->thedesc >> 0x20);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x271856);
  pSVar9 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           iVar11);
  SVar10 = *pSVar9;
  pSVar9 = Desc::rowStatus((Desc *)CONCAT44(SVar10,in_stack_ffffffffffffff90),iVar11);
  *pSVar9 = SVar10;
  reDim((SPxBasisBase<double> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void SPxBasisBase<R>::removedRow(int i)
{

   assert(status() >  NO_PROBLEM);
   assert(theLP    != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         factorized = false;

         SPxOut::debug(this, "DCHBAS05 Warning: deleting basic row!\n");
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);
      factorized = false;

      if(!theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         SPxOut::debug(this, "DCHBAS06 Warning: deleting nonbasic row!\n");
      }
      else if(status() > NO_PROBLEM && matrixIsSetup)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxRowId() && !theLP->has(SPxRowId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.rowStatus(i) = thedesc.rowStatus(theLP->nRows());
   reDim();
}